

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<no_latches_on_design::MainVisitor,_true,_false,_false,_false>::
visit<slang::ast::GenericClassDefSymbol>
          (ASTVisitor<no_latches_on_design::MainVisitor,_true,_false,_false,_false> *this,
          GenericClassDefSymbol *t)

{
  GenericClassDefSymbol *in_stack_00000038;
  ASTVisitor<no_latches_on_design::MainVisitor,_true,_false,_false,_false> *in_stack_00000040;
  
  visitDefault<slang::ast::GenericClassDefSymbol>(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }